

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_ring.h
# Opt level: O1

void __thiscall
embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::convert
          (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *this,CatmullClark1Ring *dst)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  Vec3fa *pVVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  dst->edge_level = this->edge_level;
  dst->vertex_level = this->vertex_level;
  uVar5 = *(undefined8 *)((long)&(this->vtx).field_0 + 8);
  *(undefined8 *)&(dst->vtx).field_0 = *(undefined8 *)&(this->vtx).field_0;
  *(undefined8 *)((long)&(dst->vtx).field_0 + 8) = uVar5;
  dst->face_valence = this->face_valence;
  dst->edge_valence = this->face_valence * 2;
  iVar6 = this->border_face * 2;
  if (this->border_face == -1) {
    iVar6 = -1;
  }
  dst->border_index = iVar6;
  if (this->face_valence != 0) {
    uVar7 = 0;
    do {
      fVar3 = (this->faces).data[uVar7].crease_weight;
      if (0xf < uVar7) {
        GeneralCatmullClark1RingT<embree::Vec3fa,embree::Vec3fa>::convert();
      }
      (dst->crease_weight).data[uVar7] = fVar3;
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->face_valence);
  }
  dst->vertex_crease_weight = this->vertex_crease_weight;
  if (this->edge_valence != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      pVVar4 = (this->ring).data;
      if (0x1f < uVar7) {
        GeneralCatmullClark1RingT<embree::Vec3fa,embree::Vec3fa>::convert();
      }
      uVar7 = uVar7 + 1;
      puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar8);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&((dst->ring).data)->field_0 + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < this->edge_valence);
  }
  dst->eval_start_index = this->eval_start_face_index;
  dst->eval_unique_identifier = this->eval_unique_identifier;
  return;
}

Assistant:

void convert(CatmullClark1Ring& dst) const
    {
      dst.edge_level = edge_level;
      dst.vertex_level = vertex_level;
      dst.vtx = vtx;
      dst.face_valence = face_valence;
      dst.edge_valence = 2*face_valence;
      dst.border_index = border_face == -1 ? -1 : 2*border_face;
      for (size_t i=0; i<face_valence; i++) 
	dst.crease_weight[i] = faces[i].crease_weight;
      dst.vertex_crease_weight = vertex_crease_weight;
      for (size_t i=0; i<edge_valence; i++) dst.ring[i] = ring[i];

      dst.eval_start_index = eval_start_face_index;
      dst.eval_unique_identifier = eval_unique_identifier;

      assert( dst.hasValidPositions() );
    }